

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynlink_impl_unix.c
# Opt level: O2

dynlink_impl_interface dynlink_impl_interface_singleton(void)

{
  return &dynlink_impl_interface_singleton::impl_interface_unix;
}

Assistant:

dynlink_impl_interface dynlink_impl_interface_singleton(void)
{
	static struct dynlink_impl_interface_type impl_interface_unix = {
		&dynlink_impl_interface_extension_unix,
		&dynlink_impl_interface_get_name_unix,
		&dynlink_impl_interface_load_unix,
		&dynlink_impl_interface_symbol_unix,
		&dynlink_impl_interface_unload_unix,
	};

	return &impl_interface_unix;
}